

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O2

void ex_fmod(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  int iVar2;
  t_float *ptVar3;
  t_float *ptVar4;
  t_float *ptVar5;
  long lVar6;
  char *fmt;
  long lVar7;
  double dVar8;
  double __y;
  
  lVar6 = argv->ex_type;
  if (lVar6 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar5 = (optr->ex_cont).v_vec;
    }
    else {
      if (optr->ex_type == 0xe) {
LAB_00190b57:
        post("expr~: Int. error %d",0x326);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar5;
    }
    ptVar4 = (argv->ex_cont).v_vec;
    lVar6 = argv[1].ex_type;
    if (lVar6 - 0xeU < 2) {
      ptVar3 = argv[1].ex_cont.v_vec;
      iVar2 = e->exp_vsize;
      for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
        dVar8 = fmod((double)ptVar4[lVar6],(double)ptVar3[lVar6]);
        ptVar5[lVar6] = (float)dVar8;
      }
      return;
    }
    if (lVar6 == 2) {
      iVar2 = e->exp_vsize;
      fVar1 = argv[1].ex_cont.v_flt;
      for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
        dVar8 = fmod((double)ptVar4[lVar6],(double)fVar1);
        ptVar5[lVar6] = (float)dVar8;
      }
      return;
    }
    if (lVar6 == 1) {
      lVar6 = argv[1].ex_cont.v_int;
      iVar2 = e->exp_vsize;
      for (lVar7 = 0; iVar2 != (int)lVar7; lVar7 = lVar7 + 1) {
        dVar8 = fmod((double)ptVar4[lVar7],(double)lVar6);
        ptVar5[lVar7] = (float)dVar8;
      }
      return;
    }
  }
  else if (lVar6 == 2) {
    lVar6 = argv[1].ex_type;
    if (lVar6 - 0xeU < 2) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
      }
      else {
        if (optr->ex_type == 0xe) goto LAB_00190b57;
        optr->ex_type = 0xf;
        ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar5;
      }
      ptVar4 = argv[1].ex_cont.v_vec;
      iVar2 = e->exp_vsize;
      fVar1 = (argv->ex_cont).v_flt;
      for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
        dVar8 = fmod((double)fVar1,(double)ptVar4[lVar6]);
        ptVar5[lVar6] = (float)dVar8;
      }
      return;
    }
    if (lVar6 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = fmod((double)(argv->ex_cont).v_flt,(double)argv[1].ex_cont.v_flt);
        iVar2 = e->exp_vsize;
        for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
          ptVar5[lVar6] = (float)dVar8;
        }
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_flt;
LAB_00190b35:
      __y = (double)argv[1].ex_cont.v_flt;
LAB_00190b3b:
      dVar8 = fmod(dVar8,__y);
      (optr->ex_cont).v_flt = (float)dVar8;
      return;
    }
    if (lVar6 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = fmod((double)(argv->ex_cont).v_flt,(double)argv[1].ex_cont.v_int);
        iVar2 = e->exp_vsize;
        for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
          ptVar5[lVar6] = (float)dVar8;
        }
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_flt;
LAB_00190b11:
      __y = (double)argv[1].ex_cont.v_int;
      goto LAB_00190b3b;
    }
  }
  else {
    if (lVar6 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_001908ed;
    }
    lVar6 = argv[1].ex_type;
    if (lVar6 - 0xeU < 2) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
      }
      else {
        if (optr->ex_type == 0xe) goto LAB_00190b57;
        optr->ex_type = 0xf;
        ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar5;
      }
      lVar6 = (argv->ex_cont).v_int;
      ptVar4 = argv[1].ex_cont.v_vec;
      iVar2 = e->exp_vsize;
      for (lVar7 = 0; iVar2 != (int)lVar7; lVar7 = lVar7 + 1) {
        dVar8 = fmod((double)lVar6,(double)ptVar4[lVar7]);
        ptVar5[lVar7] = (float)dVar8;
      }
      return;
    }
    if (lVar6 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = fmod((double)(argv->ex_cont).v_int,(double)argv[1].ex_cont.v_flt);
        iVar2 = e->exp_vsize;
        for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
          ptVar5[lVar6] = (float)dVar8;
        }
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_int;
      goto LAB_00190b35;
    }
    if (lVar6 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = fmod((double)(argv->ex_cont).v_int,(double)argv[1].ex_cont.v_int);
        iVar2 = e->exp_vsize;
        for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
          ptVar5[lVar6] = (float)dVar8;
        }
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_int;
      goto LAB_00190b11;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_001908ed:
  pd_error(e,fmt,0x326);
  return;
}

Assistant:

static void
ex_fmod(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, fmod, (double), (double), optr, 1);
}